

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::to_extract_constant_composite_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t result_type,SPIRConstant *c,
          uint32_t *chain,uint32_t length)

{
  Constant *pCVar1;
  ID *pIVar2;
  uint uVar3;
  bool bVar4;
  SPIRType *type;
  SPIRConstant local_198;
  
  SPIRConstant::SPIRConstant(&local_198);
  local_198.super_IVariant._12_4_ = result_type;
  type = Compiler::get<spirv_cross::SPIRType>
                   (&this->super_Compiler,*(uint32_t *)&(c->super_IVariant).field_0xc);
  if ((type->basetype == Struct) || ((type->array).super_VectorView<unsigned_int>.buffer_size != 0))
  {
    __assert_fail("composite_type.basetype != SPIRType::Struct && composite_type.array.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                  ,0x1492,
                  "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                 );
  }
  if (c->specialization == true) {
    __assert_fail("!c.specialization",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                  ,0x1493,
                  "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                 );
  }
  bVar4 = Compiler::is_matrix(&this->super_Compiler,type);
  if (bVar4) {
    if (length == 1) {
      uVar3 = *chain;
      local_198.m.c[0].vecsize = (c->m).c[uVar3].vecsize;
      pCVar1 = (c->m).c[uVar3].r;
      local_198.m.c[0].r[0] = *pCVar1;
      local_198.m.c[0].r[1] = pCVar1[1];
      pCVar1 = (c->m).c[uVar3].r + 2;
      local_198.m.c[0].r[2] = *pCVar1;
      local_198.m.c[0].r[3] = pCVar1[1];
      pIVar2 = (c->m).c[uVar3].id;
      local_198.m.c[0].id._0_8_ = *(undefined8 *)pIVar2;
      local_198.m.c[0].id._8_8_ = *(undefined8 *)(pIVar2 + 2);
      goto LAB_0028dde3;
    }
    if (length != 2) {
      __assert_fail("length == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x149f,
                    "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                   );
    }
    local_198.m.c[0].r[0] = (c->m).c[*chain].r[chain[1]];
  }
  else {
    if (length != 1) {
      __assert_fail("length == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x14a7,
                    "string spirv_cross::CompilerGLSL::to_extract_constant_composite_expression(uint32_t, const SPIRConstant &, const uint32_t *, uint32_t)"
                   );
    }
    local_198.m.c[0].r[0] = (c->m).c[0].r[*chain];
  }
  local_198.m.c[0].vecsize = 1;
LAB_0028dde3:
  local_198.m.columns = 1;
  constant_expression_abi_cxx11_(__return_storage_ptr__,this,&local_198,false,false);
  SPIRConstant::~SPIRConstant(&local_198);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_extract_constant_composite_expression(uint32_t result_type, const SPIRConstant &c,
                                                              const uint32_t *chain, uint32_t length)
{
	// It is kinda silly if application actually enter this path since they know the constant up front.
	// It is useful here to extract the plain constant directly.
	SPIRConstant tmp;
	tmp.constant_type = result_type;
	auto &composite_type = get<SPIRType>(c.constant_type);
	assert(composite_type.basetype != SPIRType::Struct && composite_type.array.empty());
	assert(!c.specialization);

	if (is_matrix(composite_type))
	{
		if (length == 2)
		{
			tmp.m.c[0].vecsize = 1;
			tmp.m.columns = 1;
			tmp.m.c[0].r[0] = c.m.c[chain[0]].r[chain[1]];
		}
		else
		{
			assert(length == 1);
			tmp.m.c[0].vecsize = composite_type.vecsize;
			tmp.m.columns = 1;
			tmp.m.c[0] = c.m.c[chain[0]];
		}
	}
	else
	{
		assert(length == 1);
		tmp.m.c[0].vecsize = 1;
		tmp.m.columns = 1;
		tmp.m.c[0].r[0] = c.m.c[0].r[chain[0]];
	}

	return constant_expression(tmp);
}